

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# readInputImage.cpp
# Opt level: O2

void readInputImage(char *inFileName,float padTop,float padBottom,Envmap overrideType,bool verbose,
                   EnvmapImage *image,Header *header,RgbaChannels *channels)

{
  int iVar1;
  _Alloc_hider _Var2;
  bool bVar3;
  char cVar4;
  int iVar5;
  RgbaChannels RVar6;
  char *pcVar7;
  string *psVar8;
  ostream *poVar9;
  int *piVar10;
  Header *pHVar11;
  Array2D<Imf_3_4::Rgba> *pAVar12;
  Box<Imath_3_2::Vec2<int>_> *this;
  Envmap *pEVar13;
  InputExc *pIVar14;
  uint uVar15;
  int iVar16;
  undefined7 in_register_00000011;
  long lVar17;
  int iVar18;
  long lVar19;
  ulong uVar20;
  ulong uVar21;
  long lVar22;
  long lVar23;
  Rgba *pRVar24;
  float fVar25;
  int iVar26;
  undefined4 in_XMM1_Db;
  Box<Imath_3_2::Vec2<int>_> local_280;
  ulong local_270;
  float local_268;
  undefined8 local_258;
  RgbaInputFile in;
  string name;
  string name_1;
  Box2i imageDw;
  stringstream _iex_throw_s;
  ostream local_1a8 [376];
  
  local_258 = CONCAT44(in_XMM1_Db,padBottom);
  local_268 = padTop;
  pcVar7 = strchr(inFileName,0x25);
  if (pcVar7 == (char *)0x0) {
    name._M_dataplus._M_p._0_4_ = overrideType;
    iVar5 = Imf_3_4::globalThreadCount();
    Imf_3_4::RgbaInputFile::RgbaInputFile(&in,inFileName,iVar5);
    if (verbose) {
      poVar9 = std::operator<<((ostream *)&std::cout,"reading file ");
      poVar9 = std::operator<<(poVar9,inFileName);
      std::endl<char,std::char_traits<char>>(poVar9);
    }
    pHVar11 = (Header *)Imf_3_4::RgbaInputFile::header();
    Imf_3_4::Header::operator=(header,pHVar11);
    RVar6 = Imf_3_4::RgbaInputFile::channels();
    *channels = RVar6;
    if (overrideType < NUM_ENVMAPTYPES) {
      Imf_3_4::addEnvmap(header,(Envmap *)&name);
    }
    else {
      pHVar11 = (Header *)Imf_3_4::RgbaInputFile::header();
      cVar4 = Imf_3_4::hasEnvmap(pHVar11);
      overrideType = ENVMAP_LATLONG;
      if (cVar4 != '\0') {
        pHVar11 = (Header *)Imf_3_4::RgbaInputFile::header();
        pEVar13 = (Envmap *)Imf_3_4::envmap(pHVar11);
        overrideType = *pEVar13;
        if (ENVMAP_CUBE < overrideType) {
          iex_debugTrap();
          std::__cxx11::stringstream::stringstream((stringstream *)&_iex_throw_s);
          poVar9 = std::operator<<(local_1a8,"unknown envmap type ");
          std::ostream::operator<<((ostream *)poVar9,*pEVar13);
          pIVar14 = (InputExc *)__cxa_allocate_exception(0x48);
          Iex_3_4::InputExc::InputExc(pIVar14,(stringstream *)&_iex_throw_s);
          __cxa_throw(pIVar14,&Iex_3_4::InputExc::typeinfo,Iex_3_4::InputExc::~InputExc);
        }
      }
    }
    piVar10 = (int *)Imf_3_4::RgbaInputFile::dataWindow();
    iVar5 = piVar10[2];
    iVar18 = *piVar10;
    iVar1 = piVar10[1];
    uVar15 = piVar10[3] - iVar1;
    local_270 = (ulong)uVar15;
    iVar16 = uVar15 + 1;
    iVar26 = 0;
    uVar15 = 0;
    if (overrideType == ENVMAP_LATLONG) {
      fVar25 = (float)iVar16;
      iVar26 = (int)(fVar25 * (float)local_258 + 0.5);
      uVar15 = (uint)(fVar25 * local_268 + 0.5);
    }
    local_258 = CONCAT44(local_258._4_4_,iVar16);
    local_268 = (float)iVar26;
    __iex_throw_s = iVar18;
    EnvmapImage::resize(image,overrideType,(Box2i *)&_iex_throw_s);
    pAVar12 = EnvmapImage::pixels(image);
    Imf_3_4::RgbaInputFile::setFrameBuffer
              ((Rgba *)&in,
               (ulong)(pAVar12->_data +
                      (-(long)(int)(iVar1 - uVar15) * pAVar12->_sizeY - (long)__iex_throw_s)),1);
    Imf_3_4::RgbaInputFile::readPixels((int)&in,piVar10[1]);
    lVar19 = (long)(iVar5 - iVar18);
    lVar17 = 0;
    uVar20 = 0;
    if (0 < (int)uVar15) {
      uVar20 = (ulong)uVar15;
    }
    for (uVar21 = 0; uVar21 != uVar20; uVar21 = uVar21 + 1) {
      for (lVar22 = 0; lVar22 <= lVar19; lVar22 = lVar22 + 1) {
        *(Rgba *)((long)&pAVar12->_data[lVar22].r._h + lVar17 * pAVar12->_sizeY) =
             pAVar12->_data[pAVar12->_sizeY * (long)(int)uVar15 + lVar22];
      }
      lVar17 = lVar17 + 8;
    }
    lVar22 = (long)(int)((int)(float)local_258 + uVar15);
    lVar17 = lVar22 * 8;
    for (; lVar22 < (int)((int)local_268 + (int)(float)local_258 + uVar15); lVar22 = lVar22 + 1) {
      for (lVar23 = 0; lVar23 <= lVar19; lVar23 = lVar23 + 1) {
        *(Rgba *)((long)&pAVar12->_data[lVar23].r._h + lVar17 * pAVar12->_sizeY) =
             pAVar12->_data[pAVar12->_sizeY * (long)(int)((int)local_270 + uVar15) + lVar23];
      }
      lVar17 = lVar17 + 8;
    }
    Imf_3_4::RgbaInputFile::~RgbaInputFile(&in);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&_iex_throw_s,inFileName,(allocator<char> *)&in);
    local_258 = (long)pcVar7 - (long)inFileName;
    psVar8 = (string *)std::__cxx11::string::replace((ulong)&_iex_throw_s,local_258,(char *)0x1);
    std::__cxx11::string::string((string *)&name,psVar8);
    std::__cxx11::string::~string((string *)&_iex_throw_s);
    iVar5 = Imf_3_4::globalThreadCount();
    Imf_3_4::RgbaInputFile::RgbaInputFile
              (&in,(char *)CONCAT44(name._M_dataplus._M_p._4_4_,(Envmap)name._M_dataplus._M_p),iVar5
              );
    if (verbose) {
      poVar9 = std::operator<<((ostream *)&std::cout,"reading cube face size from file ");
      poVar9 = std::operator<<(poVar9,(string *)&name);
      std::endl<char,std::char_traits<char>>(poVar9);
    }
    piVar10 = (int *)Imf_3_4::RgbaInputFile::dataWindow();
    local_280.min.x = *piVar10;
    local_280.min.y = piVar10[1];
    local_280.max.x = piVar10[2];
    local_280.max.y = piVar10[3];
    iVar18 = local_280.max.x - local_280.min.x;
    iVar5 = local_280.max.y - local_280.min.y;
    if (iVar18 != iVar5) {
      iex_debugTrap();
      std::__cxx11::stringstream::stringstream((stringstream *)&_iex_throw_s);
      poVar9 = std::operator<<(local_1a8,"Cube face image ");
      poVar9 = std::operator<<(poVar9,(string *)&name);
      std::operator<<(poVar9," is not square.");
      pIVar14 = (InputExc *)__cxa_allocate_exception(0x48);
      Iex_3_4::InputExc::InputExc(pIVar14,(stringstream *)&_iex_throw_s);
      __cxa_throw(pIVar14,&Iex_3_4::InputExc::typeinfo,Iex_3_4::InputExc::~InputExc);
    }
    pHVar11 = (Header *)Imf_3_4::RgbaInputFile::header();
    Imf_3_4::Header::operator=(header,pHVar11);
    RVar6 = Imf_3_4::RgbaInputFile::channels();
    *channels = RVar6;
    __iex_throw_s = 1;
    Imf_3_4::addEnvmap(header,(Envmap *)&_iex_throw_s);
    iVar5 = iVar5 + 1;
    Imf_3_4::RgbaInputFile::~RgbaInputFile(&in);
    imageDw.min.x = 0;
    imageDw.min.y = 0;
    imageDw.max.y = iVar5 * 6 + -1;
    imageDw.max.x = iVar18;
    EnvmapImage::resize(image,ENVMAP_CUBE,&imageDw);
    local_268 = (float)CONCAT71(in_register_00000011,verbose);
    pAVar12 = EnvmapImage::pixels(image);
    pRVar24 = pAVar12->_data;
    local_270 = (long)(iVar5 * (iVar18 + 1)) << 3;
    for (lVar19 = 0; lVar19 != 0x18; lVar19 = lVar19 + 4) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&_iex_throw_s,inFileName,(allocator<char> *)&in);
      psVar8 = (string *)std::__cxx11::string::replace((ulong)&_iex_throw_s,local_258,(char *)0x1);
      std::__cxx11::string::string((string *)&name_1,psVar8);
      std::__cxx11::string::~string((string *)&_iex_throw_s);
      _Var2 = name_1._M_dataplus;
      iVar5 = Imf_3_4::globalThreadCount();
      Imf_3_4::RgbaInputFile::RgbaInputFile(&in,_Var2._M_p,iVar5);
      if (local_268._0_1_ != '\0') {
        poVar9 = std::operator<<((ostream *)&std::cout,"reading file ");
        poVar9 = std::operator<<(poVar9,(string *)&name_1);
        std::endl<char,std::char_traits<char>>(poVar9);
      }
      this = (Box<Imath_3_2::Vec2<int>_> *)Imf_3_4::RgbaInputFile::dataWindow();
      bVar3 = Imath_3_2::Box<Imath_3_2::Vec2<int>_>::operator!=(this,&local_280);
      if (bVar3) {
        iex_debugTrap();
        std::__cxx11::stringstream::stringstream((stringstream *)&_iex_throw_s);
        poVar9 = std::operator<<(local_1a8,"The data window of cube face ");
        poVar9 = std::operator<<(poVar9,(string *)&name_1);
        std::operator<<(poVar9," differs from the data window of other cube faces.");
        pIVar14 = (InputExc *)__cxa_allocate_exception(0x48);
        Iex_3_4::InputExc::InputExc(pIVar14,(stringstream *)&_iex_throw_s);
        __cxa_throw(pIVar14,&Iex_3_4::InputExc::typeinfo,Iex_3_4::InputExc::~InputExc);
      }
      Imf_3_4::RgbaInputFile::setFrameBuffer
                ((Rgba *)&in,
                 (ulong)(pRVar24 +
                        ((long)local_280.min.y * (~(long)local_280.max.x + (long)local_280.min.x) -
                        (long)local_280.min.x)),1);
      Imf_3_4::RgbaInputFile::readPixels((int)(Rgba *)&in,local_280.min.y);
      Imf_3_4::RgbaInputFile::~RgbaInputFile(&in);
      std::__cxx11::string::~string((string *)&name_1);
      pRVar24 = (Rgba *)((long)&(pRVar24->r)._h + local_270);
    }
    std::__cxx11::string::~string((string *)&name);
  }
  return;
}

Assistant:

void
readInputImage (
    const char    inFileName[],
    float         padTop,
    float         padBottom,
    Envmap        overrideType,
    bool          verbose,
    EnvmapImage&  image,
    Header&       header,
    RgbaChannels& channels)
{
    if (strchr (inFileName, '%'))
    {
        readSixImages (inFileName, verbose, image, header, channels);
    }
    else
    {
        readSingleImage (
            inFileName,
            padTop,
            padBottom,
            overrideType,
            verbose,
            image,
            header,
            channels);
    }
}